

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::VisibilityGroup::append
          (VisibilityGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  code *pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RCX;
  undefined4 in_EDX;
  VisibilityGroup *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  undefined4 in_stack_00000008;
  IncompleteText in_stack_0000000c;
  undefined4 in_stack_00000018;
  IncompleteText in_stack_00000088;
  IncompleteText in_stack_0000008c;
  string *in_stack_00000090;
  VisibilityGroup *in_stack_00000098;
  IncompleteText IVar3;
  undefined4 in_stack_ffffffffffffffe0;
  IncompleteText next;
  string *group_00;
  undefined4 in_stack_fffffffffffffff8;
  IncompleteText in_stack_fffffffffffffffc;
  AppendResult AVar4;
  
  IVar3 = (IncompleteText)((ulong)in_RCX >> 0x20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)*(uint *)((long)&in_RDI[2].field_2 + 8);
  next = (IncompleteText)((ulong)in_RSI >> 0x20);
  switch(__lhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    AVar4 = NOT_APPENDED;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    bVar2 = appendFractionToIncompleteInteger
                      ((VisibilityGroup *)CONCAT44(reportPart,in_stack_00000018),
                       (string *)reportMetadata,in_stack_0000000c);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      AVar4 = GROUP_INVALIDATED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    bVar2 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar2) {
      *(undefined4 *)in_RDI = 0xd;
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendDirection((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                              unaff_retaddr,in_stack_fffffffffffffffc);
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        bVar2 = appendInteger(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),IVar3);
        if (bVar2) {
          AVar4 = APPENDED;
        }
        else {
          bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                                 unaff_retaddr,in_stack_fffffffffffffffc);
          if (bVar2) {
            AVar4 = APPENDED;
          }
          else {
            bVar2 = appendVariable(in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                                   in_stack_00000088);
            if (bVar2) {
              AVar4 = APPENDED;
            }
            else {
              bVar2 = appendMeters(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),IVar3
                                  );
              if (bVar2) {
                AVar4 = APPENDED;
              }
              else {
                bVar2 = appendVariableMeters(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
                if (bVar2) {
                  AVar4 = APPENDED;
                }
                else {
                  AVar4 = GROUP_INVALIDATED;
                }
              }
            }
          }
        }
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    bVar2 = appendVariable(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088);
    IVar3 = (IncompleteText)((ulong)in_RSI >> 0x20);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                             unaff_retaddr,in_stack_fffffffffffffffc);
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        bVar2 = appendRunway((VisibilityGroup *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             IVar3);
        if (bVar2) {
          AVar4 = APPENDED;
        }
        else {
          AVar4 = GROUP_INVALIDATED;
        }
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    bVar2 = appendRunway((VisibilityGroup *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,next);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      AVar4 = GROUP_INVALIDATED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    group_00 = in_RDI;
    bVar2 = appendVariableMaxFraction(this,group,reportPart);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendRunway((VisibilityGroup *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),group_00,
                           (IncompleteText)((ulong)in_RSI >> 0x20));
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
        AVar4 = NOT_APPENDED;
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    bVar2 = appendRunway((VisibilityGroup *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,next);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
      AVar4 = NOT_APPENDED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    bVar2 = appendInteger(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),IVar3);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendVariable(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088
                            );
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                               unaff_retaddr,in_stack_fffffffffffffffc);
        if (bVar2) {
          AVar4 = APPENDED;
        }
        else {
          bVar2 = appendVariableMeters(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
          if (bVar2) {
            AVar4 = APPENDED;
          }
          else {
            AVar4 = GROUP_INVALIDATED;
          }
        }
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                           unaff_retaddr,in_stack_fffffffffffffffc);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendVariable(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088
                            );
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
        AVar4 = NOT_APPENDED;
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    bVar2 = appendVariableMaxFraction(this,group,reportPart);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
      AVar4 = NOT_APPENDED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
    bVar2 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar2) {
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0xb;
      AVar4 = APPENDED;
    }
    else {
      AVar4 = GROUP_INVALIDATED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
    bVar2 = appendInteger(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),IVar3);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                             unaff_retaddr,in_stack_fffffffffffffffc);
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        bVar2 = appendMeters(in_RSI,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),IVar3);
        if (bVar2) {
          AVar4 = APPENDED;
        }
        else {
          AVar4 = GROUP_INVALIDATED;
        }
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
    bVar2 = appendFraction((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                           unaff_retaddr,in_stack_fffffffffffffffc);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendVariable(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_00000088
                            );
      if (bVar2) {
        AVar4 = GROUP_INVALIDATED;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
        AVar4 = NOT_APPENDED;
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
    bVar2 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar2) {
      *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
      AVar4 = APPENDED;
    }
    else {
      AVar4 = GROUP_INVALIDATED;
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
    bVar2 = appendRunway((VisibilityGroup *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,next);
    if (bVar2) {
      AVar4 = APPENDED;
    }
    else {
      bVar2 = appendDirection((VisibilityGroup *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                              unaff_retaddr,in_stack_fffffffffffffffc);
      if (bVar2) {
        AVar4 = APPENDED;
      }
      else {
        *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
        AVar4 = NOT_APPENDED;
      }
    }
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return AVar4;
}

Assistant:

AppendResult VisibilityGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportPart;(void)reportMetadata;

	switch (incompleteText) {
		case IncompleteText::NONE:
		return AppendResult::NOT_APPENDED;

		case IncompleteText::INTEGER:
		if (appendFractionToIncompleteInteger(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;
		
		case IncompleteText::VIS:
		if (group == "MISG") {
			visType = Type::VIS_MISG;
			incompleteText = IncompleteText::NONE;
			return AppendResult::APPENDED; 
		}
		if (appendDirection(group, IncompleteText::VIS_DIR)) return AppendResult::APPENDED;
		if (appendInteger(group, IncompleteText::VIS_INTEGER)) return AppendResult::APPENDED;
		if (appendFraction(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_VAR_MAX_INT, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendMeters(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendVariableMeters(group, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_INTEGER:
		if (appendVariable(group, IncompleteText::VIS_VAR_MAX_INT, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendFraction(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendRunway(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_VAR_MAX_INT:
		if (appendVariableMaxFraction(group, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendRunway(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_VAR:
		if (appendRunway(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_FRACTION_OR_METERS:
		if (appendRunway(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_DIR:
		if (appendInteger(group, IncompleteText::VIS_DIR_INTEGER)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_DIR_VAR_MAX_INT)) return AppendResult::APPENDED;
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariableMeters(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_DIR_INTEGER:
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_DIR_VAR_MAX_INT)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_DIR_VAR_MAX_INT:
		if (appendVariableMaxFraction(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::SFC_OR_TWR:
		if (group == "VIS") {
			incompleteText = IncompleteText::SFC_OR_TWR_VIS;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::SFC_OR_TWR_VIS:
		if (appendInteger(group, IncompleteText::SFC_OR_TWR_VIS_INTEGER)) return AppendResult::APPENDED;
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendMeters(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::SFC_OR_TWR_VIS_INTEGER:
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariable(group)) return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::RVR:
		if (group == "MISG") {
			incompleteText = IncompleteText::NONE;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VISNO:
		if (appendRunway(group)) return AppendResult::APPENDED;
		if (appendDirection(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;
	}
}